

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O2

int lj_cf_package_require(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  int iVar3;
  char *k;
  char *pcVar4;
  
  k = luaL_checklstring(L,1,(size_t *)0x0);
  lua_settop(L,1);
  lua_getfield(L,-10000,"_LOADED");
  lua_getfield(L,2,k);
  iVar2 = lua_toboolean(L,-1);
  if (iVar2 == 0) {
    lua_getfield(L,-0x2711,"loaders");
    iVar2 = lua_type(L,-1);
    if (iVar2 != 5) {
      luaL_error(L,"\'package.loaders\' must be a table");
    }
    lua_pushlstring(L,"",0);
    iVar2 = 1;
    while( true ) {
      lua_rawgeti(L,-2,iVar2);
      iVar3 = lua_type(L,-1);
      if (iVar3 == 0) {
        pcVar4 = lua_tolstring(L,-2,(size_t *)0x0);
        luaL_error(L,"module \'%s\' not found:%s",k,pcVar4);
      }
      lua_pushstring(L,k);
      lua_call(L,1,1);
      iVar3 = lua_type(L,-1);
      if (iVar3 == 6) break;
      iVar3 = lua_isstring(L,-1);
      if (iVar3 == 0) {
        lua_settop(L,-2);
      }
      else {
        lua_concat(L,2);
      }
      iVar2 = iVar2 + 1;
    }
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->n = -5.68175492717434e-322;
    lua_setfield(L,2,k);
    lua_pushstring(L,k);
    lua_call(L,1,1);
    iVar2 = lua_type(L,-1);
    if (iVar2 != 0) {
      lua_setfield(L,2,k);
    }
    lua_getfield(L,2,k);
    if (L->top[-1].u64 == 0x8000000000000073) {
      lua_pushboolean(L,1);
      lua_pushvalue(L,-1);
      lua_setfield(L,2,k);
    }
  }
  else if (L->top[-1].u64 == 0x8000000000000073) {
    luaL_error(L,"loop or previous error loading module \'%s\'",k);
  }
  return 1;
}

Assistant:

static int lj_cf_package_require(lua_State *L)
{
  const char *name = luaL_checkstring(L, 1);
  int i;
  lua_settop(L, 1);  /* _LOADED table will be at index 2 */
  lua_getfield(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_getfield(L, 2, name);
  if (lua_toboolean(L, -1)) {  /* is it there? */
    if ((L->top-1)->u64 == KEY_SENTINEL)  /* check loops */
      luaL_error(L, "loop or previous error loading module " LUA_QS, name);
    return 1;  /* package is already loaded */
  }
  /* else must load it; iterate over available loaders */
  lua_getfield(L, LUA_ENVIRONINDEX, "loaders");
  if (!lua_istable(L, -1))
    luaL_error(L, LUA_QL("package.loaders") " must be a table");
  lua_pushliteral(L, "");  /* error message accumulator */
  for (i = 1; ; i++) {
    lua_rawgeti(L, -2, i);  /* get a loader */
    if (lua_isnil(L, -1))
      luaL_error(L, "module " LUA_QS " not found:%s",
		 name, lua_tostring(L, -2));
    lua_pushstring(L, name);
    lua_call(L, 1, 1);  /* call it */
    if (lua_isfunction(L, -1))  /* did it find module? */
      break;  /* module loaded successfully */
    else if (lua_isstring(L, -1))  /* loader returned error message? */
      lua_concat(L, 2);  /* accumulate it */
    else
      lua_pop(L, 1);
  }
  (L->top++)->u64 = KEY_SENTINEL;
  lua_setfield(L, 2, name);  /* _LOADED[name] = sentinel */
  lua_pushstring(L, name);  /* pass name as argument to module */
  lua_call(L, 1, 1);  /* run loaded module */
  if (!lua_isnil(L, -1))  /* non-nil return? */
    lua_setfield(L, 2, name);  /* _LOADED[name] = returned value */
  lua_getfield(L, 2, name);
  if ((L->top-1)->u64 == KEY_SENTINEL) {   /* module did not set a value? */
    lua_pushboolean(L, 1);  /* use true as result */
    lua_pushvalue(L, -1);  /* extra copy to be returned */
    lua_setfield(L, 2, name);  /* _LOADED[name] = true */
  }
  lj_lib_checkfpu(L);
  return 1;
}